

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

ui_event textui_get_command(int *count)

{
  int *piVar1;
  uint k;
  undefined4 uVar2;
  _Bool _Var3;
  undefined4 uVar4;
  int iVar5;
  char *str;
  ushort **ppuVar6;
  keypress *__src;
  undefined8 extraout_RDX;
  size_t __n;
  ulong uVar7;
  ui_event uVar8;
  keypress kVar9;
  ui_event local_60;
  uint local_54;
  int *local_50;
  keypress tmp [2];
  
  local_54 = (uint)(player->opts).opt[1];
  tmp[0].type = EVT_NONE;
  tmp[0].code = 0;
  tmp[0].mods = '\0';
  tmp[0]._9_3_ = 0;
  tmp[1].type = EVT_NONE;
  tmp[1].code = 0;
  tmp[1].mods = '\0';
  tmp[1]._9_3_ = 0;
  local_60._8_4_ = 0;
  __src = (keypress *)0x0;
  local_50 = count;
LAB_001c58b5:
  do {
    msg_flag = false;
    inkey_flag = true;
    if ((player->opts).opt[9] == true) {
      Term_set_cursor(true);
      move_cursor_relative((player->grid).y,(player->grid).x);
    }
    uVar8 = inkey_ex();
    uVar4 = uVar8.type;
    local_60.key.code = uVar8.key.code;
    uVar2 = local_60.key.code;
    local_60.key.mods = uVar8.key.mods;
    local_60.type = uVar4;
    if ((player->opts).opt[9] == true) {
      Term_set_cursor(false);
    }
    if (uVar4 != EVT_KBRD) {
LAB_001c5a75:
      prt("",L'\0',L'\0');
      if (uVar4 == EVT_BUTTON) {
        tmp[0]._8_4_ = local_60._8_4_;
        tmp[0].type = local_60._0_4_;
        tmp[0].code = local_60._4_4_;
        __src = tmp;
      }
      if (((local_60.key.code == 0) || (__src == (keypress *)0x0)) ||
         (inkey_next != (keypress *)0x0)) {
        uVar8.key.code = local_60.key.code;
        uVar8.type = local_60.type;
        uVar8._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_60.key.mods);
        return uVar8;
      }
      __n = 0;
      do {
        piVar1 = (int *)((long)&__src->type + __n);
        __n = __n + 0xc;
      } while (*piVar1 != 0);
      memcpy(request_command_buffer,__src,__n);
      inkey_next = request_command_buffer;
      goto LAB_001c58b5;
    }
    if (uVar2 != 0x30) {
      if (uVar2 == 0x5e) {
        _Var3 = get_com_ex("Control: ",&local_60);
        if ((!_Var3) || (local_60.type != EVT_KBRD)) goto LAB_001c58b5;
        if ((local_60.key.code & 0xffffffe0) == 0x40 || local_60.key.code - 0x61 < 0x1a) {
          local_60.key.code = local_60.key.code & 0x1f;
        }
        else {
          local_60._8_4_ = local_60._8_4_ | 1;
        }
      }
      else if (uVar2 == 0x5c) {
        get_com_ex("Command: ",&local_60);
        uVar4 = local_60.type;
        goto LAB_001c5a75;
      }
LAB_001c5a5d:
      uVar4 = local_60.type;
      kVar9.code = local_60.key.code;
      kVar9.type = local_60.type;
      kVar9._8_4_ = local_60._8_4_;
      __src = keymap_find(local_54,kVar9);
      goto LAB_001c5a75;
    }
    if (((undefined1  [12])uVar8 & (undefined1  [12])0x10) != (undefined1  [12])0x0)
    goto LAB_001c5a5d;
    iVar5 = 0;
    while( true ) {
      str = format("Repeat: %d");
      prt(str,L'\0',L'\0');
      kVar9 = inkey();
      uVar7 = kVar9._0_8_ >> 0x20;
      if (uVar7 == 0xe000) break;
      k = kVar9.code;
      if (k >> 1 == 0x4f) {
        iVar5 = iVar5 / 10;
      }
      else {
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (uVar7 & 0xff) * 2 + 1) & 8) == 0) {
          if (k != 0x9c) {
            Term_keypress(k,kVar9.mods);
          }
          if (iVar5 != -1) {
            _Var3 = get_com_ex("Command: ",&local_60);
            if (_Var3) {
              *local_50 = iVar5;
              goto LAB_001c5a5d;
            }
          }
          break;
        }
        iVar5 = iVar5 * 10 + k + -0x30;
        if (0x270e < iVar5) {
          bell();
          iVar5 = 9999;
        }
      }
    }
  } while( true );
}

Assistant:

ui_event textui_get_command(int *count)
{
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	struct keypress tmp[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

	ui_event ke = EVENT_EMPTY;

	const struct keypress *act = NULL;



	/* Get command */
	while (1) {
		/* Hack -- no flush needed */
		msg_flag = false;

		/* Activate "command mode" */
		inkey_flag = true;

		/* Toggle on cursor if requested */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(true);
			move_cursor_relative(player->grid.y, player->grid.x);
		}

		/* Get a command */
		ke = inkey_ex();

		/* Toggle off cursor */
		if (OPT(player, highlight_player)) {
			Term_set_cursor(false);
		}

		if (ke.type == EVT_KBRD) {
			bool keymap_ok = true;
			switch (ke.key.code) {
				case '0': {
					if(ke.key.mods & KC_MOD_KEYPAD) break;

					int c = textui_get_count();

					if (c == -1 || !get_com_ex("Command: ", &ke))
						continue;
					else
						*count = c;
					break;
				}

				case '\\': {
					/* Allow keymaps to be bypassed */
					(void)get_com_ex("Command: ", &ke);
					keymap_ok = false;
					break;
				}

				case '^': {
					/* Allow "control chars" to be entered */
					if (!get_com_ex("Control: ", &ke)
							|| ke.type != EVT_KBRD) {
						continue;
					}
					if (ENCODE_KTRL(ke.key.code)) {
						ke.key.code = KTRL(ke.key.code);
					} else {
						ke.key.mods |= KC_MOD_CONTROL;
					}
					break;
				}
			}

			/* Find any relevant keymap */
			if (keymap_ok)
				act = keymap_find(mode, ke.key);
		}

		/* Erase the message line */
		prt("", 0, 0);

		if (ke.type == EVT_BUTTON) {
			/* Buttons are always specified in standard keyset */
			act = tmp;
			tmp[0] = ke.key;
		}

		/* Apply keymap if not inside a keymap already */
		if (ke.key.code && act && !inkey_next) {
			size_t n = 0;
			while (act[n].type)
				n++;

			/* Make room for the terminator */
			n += 1;

			/* Install the keymap */
			memcpy(request_command_buffer, act, n * sizeof(struct keypress));

			/* Start using the buffer */
			inkey_next = request_command_buffer;

			/* Continue */
			continue;
		}

		/* Done */
		break;
	}

	return ke;
}